

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resizeIndexObject(sqlite3 *db,Index *pIdx,int N)

{
  i16 *__dest;
  char **ppcVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  if ((int)(uint)pIdx->nColumn < N) {
    ppcVar1 = (char **)sqlite3DbMallocZero(db,(long)(N * 0xd));
    if (ppcVar1 == (char **)0x0) {
      iVar2 = 7;
    }
    else {
      uVar3 = (ulong)(uint)N;
      memcpy(ppcVar1,pIdx->azColl,(ulong)pIdx->nColumn << 3);
      pIdx->azColl = ppcVar1;
      ppcVar1 = ppcVar1 + uVar3;
      memcpy(ppcVar1,pIdx->aiRowLogEst,(ulong)pIdx->nKeyCol * 2 + 2);
      pIdx->aiRowLogEst = (LogEst *)ppcVar1;
      __dest = (i16 *)((long)ppcVar1 + uVar3 * 2);
      memcpy(__dest,pIdx->aiColumn,(ulong)((uint)pIdx->nColumn * 2));
      pIdx->aiColumn = __dest;
      memcpy(__dest + uVar3,pIdx->aSortOrder,(ulong)pIdx->nColumn);
      pIdx->aSortOrder = (u8 *)(__dest + uVar3);
      pIdx->nColumn = (u16)N;
      pIdx->field_0x63 = pIdx->field_0x63 | 0x10;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int resizeIndexObject(sqlite3 *db, Index *pIdx, int N){
  char *zExtra;
  int nByte;
  if( pIdx->nColumn>=N ) return SQLITE_OK;
  assert( pIdx->isResized==0 );
  nByte = (sizeof(char*) + sizeof(LogEst) + sizeof(i16) + 1)*N;
  zExtra = sqlite3DbMallocZero(db, nByte);
  if( zExtra==0 ) return SQLITE_NOMEM_BKPT;
  memcpy(zExtra, pIdx->azColl, sizeof(char*)*pIdx->nColumn);
  pIdx->azColl = (const char**)zExtra;
  zExtra += sizeof(char*)*N;
  memcpy(zExtra, pIdx->aiRowLogEst, sizeof(LogEst)*(pIdx->nKeyCol+1));
  pIdx->aiRowLogEst = (LogEst*)zExtra;
  zExtra += sizeof(LogEst)*N;
  memcpy(zExtra, pIdx->aiColumn, sizeof(i16)*pIdx->nColumn);
  pIdx->aiColumn = (i16*)zExtra;
  zExtra += sizeof(i16)*N;
  memcpy(zExtra, pIdx->aSortOrder, pIdx->nColumn);
  pIdx->aSortOrder = (u8*)zExtra;
  pIdx->nColumn = N;
  pIdx->isResized = 1;
  return SQLITE_OK;
}